

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall ghc::filesystem::path::iterator::updateCurrent(iterator *this)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  bool bVar1;
  reference pcVar2;
  const_iterator last;
  ulong uVar3;
  string *psVar4;
  char *pcVar5;
  bool local_29;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  iterator *local_10;
  iterator *this_local;
  
  local_10 = this;
  bVar1 = __gnu_cxx::operator!=(&this->_iter,&this->_first);
  local_29 = false;
  if (bVar1) {
    bVar1 = __gnu_cxx::operator!=(&this->_iter,&this->_last);
    local_29 = false;
    if (bVar1) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&this->_iter);
      local_29 = false;
      if (*pcVar2 == '/') {
        bVar1 = __gnu_cxx::operator!=(&this->_iter,&this->_root);
        local_29 = false;
        if (bVar1) {
          local_18 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(&this->_iter,1);
          local_29 = __gnu_cxx::operator==(&local_18,&this->_last);
        }
      }
    }
  }
  if (local_29 == false) {
    first._M_current = (this->_iter)._M_current;
    last = increment(this,&this->_iter);
    assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (&this->_current,first,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )last._M_current);
    generic_string_abi_cxx11_(&this->_current);
    uVar3 = std::__cxx11::string::size();
    if (1 < uVar3) {
      psVar4 = generic_string_abi_cxx11_(&this->_current);
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar4);
      if (*pcVar5 == '/') {
        psVar4 = generic_string_abi_cxx11_(&this->_current);
        generic_string_abi_cxx11_(&this->_current);
        std::__cxx11::string::size();
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar4);
        if (*pcVar5 == '/') {
          path::operator=(&this->_current,(char (*) [2])"/");
        }
      }
    }
  }
  else {
    path::operator=(&this->_current,(char (*) [1])0x228cc2);
  }
  return;
}

Assistant:

GHC_INLINE void path::iterator::updateCurrent()
{
    if (_iter != _first && _iter != _last && (*_iter == '/' && _iter != _root) && (_iter + 1 == _last)) {
        _current = "";
    }
    else {
        _current.assign(_iter, increment(_iter));
        if (_current.generic_string().size() > 1 && _current.generic_string()[0] == '/' && _current.generic_string()[_current.generic_string().size() - 1] == '/') {
            // shrink successive slashes to one
            _current = "/";
        }
    }
}